

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

void Nwk_NodeUpdateRequired(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Nwk_Obj_t *pObj_00;
  bool bVar3;
  float fVar4;
  float f2;
  int nTerms;
  int iTerm1;
  int iBox;
  int k;
  int iCur;
  float tRequired;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pTemp;
  Vec_Ptr_t *vQueue;
  Tim_Man_t *pManTime;
  Nwk_Obj_t *pObj_local;
  
  p = pObj->pMan->pManTime;
  p_00 = pObj->pMan->vTemp;
  _iCur = (Nwk_Obj_t *)0x0;
  iVar1 = Nwk_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x289,"void Nwk_NodeUpdateRequired(Nwk_Obj_t *)");
  }
  fVar4 = Nwk_NodeComputeRequired(pObj,1);
  f2 = Nwk_ObjRequired(pObj);
  iVar1 = Nwk_ManTimeEqual(fVar4,f2,0.01);
  if (iVar1 != 0) {
    Vec_PtrClear(p_00);
    iTerm1 = 0;
    while( true ) {
      bVar3 = false;
      if (iTerm1 < pObj->nFanins) {
        _iCur = pObj->pFanio[iTerm1];
        bVar3 = _iCur != (Nwk_Obj_t *)0x0;
      }
      if (!bVar3) break;
      if ((*(uint *)&_iCur->field_0x20 >> 4 & 1) == 0) {
        Nwk_NodeUpdateAddToQueue(p_00,_iCur,-1,0);
        *(uint *)&_iCur->field_0x20 = *(uint *)&_iCur->field_0x20 & 0xffffffef | 0x10;
      }
      iTerm1 = iTerm1 + 1;
    }
    if (p != (Tim_Man_t *)0x0) {
      Tim_ManIncrementTravId(p);
    }
    for (iBox = 0; iVar1 = Vec_PtrSize(p_00), iBox < iVar1; iBox = iBox + 1) {
      pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(p_00,iBox);
      *(uint *)&pObj_00->field_0x20 = *(uint *)&pObj_00->field_0x20 & 0xffffffef;
      k = (int)Nwk_NodeComputeRequired(pObj_00,1);
      iVar1 = Nwk_ObjIsCo(pObj_00);
      if ((iVar1 != 0) && (p != (Tim_Man_t *)0x0)) {
        k = (int)Tim_ManGetCoRequired(p,*(uint *)&pObj_00->field_0x20 >> 7);
      }
      fVar4 = Nwk_ObjRequired(pObj_00);
      iVar1 = Nwk_ManTimeEqual((float)k,fVar4,0.01);
      if (iVar1 == 0) {
        Nwk_ObjSetRequired(pObj_00,(float)k);
        iVar1 = Nwk_ObjIsCi(pObj_00);
        if (iVar1 == 0) {
          iTerm1 = 0;
          while( true ) {
            bVar3 = false;
            if (iTerm1 < pObj_00->nFanins) {
              _iCur = pObj_00->pFanio[iTerm1];
              bVar3 = _iCur != (Nwk_Obj_t *)0x0;
            }
            if (!bVar3) break;
            if ((*(uint *)&_iCur->field_0x20 >> 4 & 1) == 0) {
              Nwk_NodeUpdateAddToQueue(p_00,_iCur,iBox,0);
              *(uint *)&_iCur->field_0x20 = *(uint *)&_iCur->field_0x20 & 0xffffffef | 0x10;
            }
            iTerm1 = iTerm1 + 1;
          }
        }
        else if ((p != (Tim_Man_t *)0x0) &&
                (iVar1 = Tim_ManBoxForCi(p,*(uint *)&pObj_00->field_0x20 >> 7), -1 < iVar1)) {
          iVar2 = Tim_ManIsCiTravIdCurrent(p,*(uint *)&pObj_00->field_0x20 >> 7);
          if (iVar2 != 0) {
            Tim_ManSetPreviousTravIdBoxOutputs(p,iVar1);
          }
          Tim_ManSetCiRequired(p,*(uint *)&pObj_00->field_0x20 >> 7,(float)k);
          Tim_ManSetCurrentTravIdBoxOutputs(p,iVar1);
          iVar2 = Tim_ManBoxInputFirst(p,iVar1);
          iVar1 = Tim_ManBoxInputNum(p,iVar1);
          for (iTerm1 = 0; iTerm1 < iVar1; iTerm1 = iTerm1 + 1) {
            _iCur = Nwk_ManCo(_iCur->pMan,iVar2 + iTerm1);
            if ((*(uint *)&_iCur->field_0x20 >> 4 & 1) == 0) {
              Nwk_NodeUpdateAddToQueue(p_00,_iCur,iBox,0);
              *(uint *)&_iCur->field_0x20 = *(uint *)&_iCur->field_0x20 & 0xffffffef | 0x10;
            }
          }
        }
      }
    }
    return;
  }
  __assert_fail("Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                ,0x28c,"void Nwk_NodeUpdateRequired(Nwk_Obj_t *)");
}

Assistant:

void Nwk_NodeUpdateRequired( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    float tRequired;
    int iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // make sure the node's required time remained the same
    tRequired = Nwk_NodeComputeRequired( pObj, 1 );
    assert( Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 ) );
    // initialize the queue with the node's faninsa and the old node's fanins
    Vec_PtrClear( vQueue );
    Nwk_ObjForEachFanin( pObj, pNext, k )
    {
        if ( pNext->MarkA )
            continue;
        Nwk_NodeUpdateAddToQueue( vQueue, pNext, -1, 0 );
        pNext->MarkA = 1;
    }
    // process objects
    if ( pManTime )
        Tim_ManIncrementTravId( pManTime );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        tRequired = Nwk_NodeComputeRequired( pTemp, 1 );
        if ( Nwk_ObjIsCo(pTemp) && pManTime )
            tRequired = Tim_ManGetCoRequired( pManTime, pTemp->PioId );
        if ( Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pTemp), (float)0.01 ) )
            continue;
        Nwk_ObjSetRequired( pTemp, tRequired );
        // add the fanins to the queue
        if ( Nwk_ObjIsCi(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCi( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this CI is an output of the box
                {
                    // it may happen that a box-output (CI) was already marked as visited
                    // when some other box-output of the same box was visited - here we undo this
                    if ( Tim_ManIsCiTravIdCurrent( pManTime, pTemp->PioId ) )
                        Tim_ManSetPreviousTravIdBoxOutputs( pManTime, iBox );
                    Tim_ManSetCiRequired( pManTime, pTemp->PioId, tRequired );
                    Tim_ManSetCurrentTravIdBoxOutputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCo(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 0 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanin( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 0 );
                pNext->MarkA = 1;
            }
        }
    }
}